

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

void __thiscall polyscope::CurveNetwork::preparePick(CurveNetwork *this)

{
  ManagedBuffer<unsigned_int> *this_00;
  undefined1 *this_01;
  shared_ptr<polyscope::render::ShaderProgram> *this_02;
  undefined8 uVar1;
  uint uVar2;
  element_type *peVar3;
  long *plVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t i;
  size_t iE;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar14 [56];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vec3 vVar15;
  vec3 vVar16;
  vec3 vVar17;
  allocator_type local_193;
  allocator local_192;
  allocator local_191;
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_190;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickEdge;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  pickColors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickTip;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined1 local_c8 [16];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  this_00 = &this->edgeTailInds;
  render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(this_00);
  render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(&this->edgeTipInds);
  this_01 = &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  sVar5 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_01);
  sVar6 = render::ManagedBuffer<unsigned_int>::size(this_00);
  sVar6 = pick::requestPickBufferRange((Structure *)this,sVar5 + sVar6);
  plVar4 = render::engine;
  std::__cxx11::string::string((string *)&pickColors,"RAYCAST_SPHERE",&local_191);
  std::__cxx11::string::string((string *)&edgePickTip,"SPHERE_PROPAGATE_COLOR",&local_192);
  __l._M_len = 1;
  __l._M_array = (iterator)&edgePickTip;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l,&local_193);
  addCurveNetworkNodeRules
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&edgePickEdge,this,&local_e0);
  (**(code **)(*plVar4 + 0x158))(&local_190,plVar4,&pickColors,&edgePickEdge,2);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodePickProgram).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             &local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&edgePickEdge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  std::__cxx11::string::~string((string *)&edgePickTip);
  std::__cxx11::string::~string((string *)&pickColors);
  pickColors.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pickColors.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  auVar10 = ZEXT1664((undefined1  [16])
                     pickColors.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._0_16_);
  sVar5 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_01);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::reserve(&pickColors,sVar5);
  sVar5 = sVar6;
  while( true ) {
    auVar14 = auVar10._8_56_;
    sVar7 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                      ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_01);
    if (sVar7 + sVar6 <= sVar5) break;
    pick::indToVec(sVar5);
    vVar15 = pick::indToVec(sVar5);
    edgePickTip.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = vVar15.field_2;
    auVar10._0_8_ = vVar15._0_8_;
    auVar10._8_56_ = auVar14;
    edgePickTip.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)vmovlps_avx(auVar10._0_16_);
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&pickColors,(vec<3,_float,_(glm::qualifier)0> *)&edgePickTip);
    sVar5 = sVar5 + 1;
  }
  peVar3 = (this->nodePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_50,"a_color",(allocator *)&edgePickTip);
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_50,&pickColors);
  std::__cxx11::string::~string(local_50);
  fillNodeGeometryBuffers
            (this,(this->nodePickProgram).
                  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&pickColors.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  plVar4 = render::engine;
  std::__cxx11::string::string((string *)&pickColors,"RAYCAST_CYLINDER",&local_191);
  std::__cxx11::string::string((string *)&edgePickTip,"CYLINDER_PROPAGATE_PICK",&local_192);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&edgePickTip;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,__l_00,&local_193);
  addCurveNetworkEdgeRules
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&edgePickEdge,this,&local_f8);
  (**(code **)(*plVar4 + 0x158))(&local_190,plVar4,&pickColors,&edgePickEdge,2);
  this_02 = &this->edgePickProgram;
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_02->
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             &local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&edgePickEdge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::__cxx11::string::~string((string *)&edgePickTip);
  auVar13._0_8_ = std::__cxx11::string::~string((string *)&pickColors);
  auVar13._8_56_ = extraout_var;
  sVar5 = render::ManagedBuffer<unsigned_int>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&pickColors,sVar5,(allocator_type *)&edgePickTip);
  sVar5 = render::ManagedBuffer<unsigned_int>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&edgePickTip,sVar5,(allocator_type *)&edgePickEdge);
  sVar5 = render::ManagedBuffer<unsigned_int>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&edgePickEdge,sVar5,(allocator_type *)&local_190);
  lVar8 = 2;
  uVar9 = 0;
  while( true ) {
    auVar14 = auVar13._8_56_;
    sVar5 = render::ManagedBuffer<unsigned_int>::size(this_00);
    if (sVar5 <= uVar9) break;
    uVar2 = (((this->edgeTipInds).data)->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9];
    vVar15 = pick::indToVec((((this->edgeTailInds).data)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar9] + sVar6);
    auVar11._0_8_ = vVar15._0_8_;
    auVar11._8_56_ = auVar14;
    vVar16 = pick::indToVec(uVar2 + sVar6);
    auVar12._0_8_ = vVar16._0_8_;
    auVar12._8_56_ = auVar14;
    local_c8 = auVar12._0_16_;
    sVar5 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                      ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_01);
    vVar17 = pick::indToVec(sVar5 + sVar6 + uVar9);
    auVar13._0_8_ = vVar17._0_8_;
    auVar13._8_56_ = auVar14;
    uVar9 = uVar9 + 1;
    uVar1 = vmovlps_avx(auVar11._0_16_);
    *(undefined8 *)
     ((long)pickColors.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar8 * 4 + -8) = uVar1;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
     (&(pickColors.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar8) = vVar15.field_2;
    uVar1 = vmovlps_avx(local_c8);
    *(undefined8 *)
     ((long)edgePickTip.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar8 * 4 + -8) = uVar1;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
     (&(edgePickTip.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar8) = vVar16.field_2;
    uVar1 = vmovlps_avx(auVar13._0_16_);
    *(undefined8 *)
     ((long)edgePickEdge.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar8 * 4 + -8) = uVar1;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
     (&(edgePickEdge.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar8) = vVar17.field_2;
    lVar8 = lVar8 + 3;
  }
  peVar3 = (this_02->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_70,"a_color_tail",(allocator *)&local_190);
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_70,&pickColors);
  std::__cxx11::string::~string(local_70);
  peVar3 = (this_02->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_90,"a_color_tip",(allocator *)&local_190);
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_90,&edgePickTip);
  std::__cxx11::string::~string(local_90);
  peVar3 = (this_02->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_b0,"a_color_edge",(allocator *)&local_190);
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_b0,&edgePickEdge);
  std::__cxx11::string::~string(local_b0);
  fillEdgeGeometryBuffers
            (this,(this->edgePickProgram).
                  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&edgePickEdge.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&edgePickTip.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&pickColors.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  return;
}

Assistant:

void CurveNetwork::preparePick() {
  edgeTailInds.ensureHostBufferPopulated();
  edgeTipInds.ensureHostBufferPopulated();

  // Pick index layout (local indices):
  //   |     --- nodes ---     |      --- edges ---      |
  //   ^                       ^
  //   0                    nNodes()

  // Request pick indices
  size_t totalPickElements = nNodes() + nEdges();
  size_t pickStart = pick::requestPickBufferRange(this, totalPickElements);

  { // Set up node picking program
    nodePickProgram =
        render::engine->requestShader("RAYCAST_SPHERE", addCurveNetworkNodeRules({"SPHERE_PROPAGATE_COLOR"}),
                                      render::ShaderReplacementDefaults::Pick);

    // Fill color buffer with packed point indices
    std::vector<glm::vec3> pickColors;
    pickColors.reserve(nNodes());
    for (size_t i = pickStart; i < pickStart + nNodes(); i++) {
      glm::vec3 val = pick::indToVec(i);
      pickColors.push_back(pick::indToVec(i));
    }

    // Store data in buffers
    nodePickProgram->setAttribute("a_color", pickColors);

    fillNodeGeometryBuffers(*nodePickProgram);
  }

  { // Set up edge picking program
    edgePickProgram =
        render::engine->requestShader("RAYCAST_CYLINDER", addCurveNetworkEdgeRules({"CYLINDER_PROPAGATE_PICK"}),
                                      render::ShaderReplacementDefaults::Pick);

    // Fill color buffer with packed node/edge indices
    std::vector<glm::vec3> edgePickTail(nEdges());
    std::vector<glm::vec3> edgePickTip(nEdges());
    std::vector<glm::vec3> edgePickEdge(nEdges());

    // Fill posiiton and pick index buffers
    for (size_t iE = 0; iE < nEdges(); iE++) {
      size_t eTail = edgeTailInds.data[iE];
      size_t eTip = edgeTipInds.data[iE];

      glm::vec3 colorValTail = pick::indToVec(pickStart + eTail);
      glm::vec3 colorValTip = pick::indToVec(pickStart + eTip);
      glm::vec3 colorValEdge = pick::indToVec(pickStart + nNodes() + iE);
      edgePickTail[iE] = colorValTail;
      edgePickTip[iE] = colorValTip;
      edgePickEdge[iE] = colorValEdge;
    }
    edgePickProgram->setAttribute("a_color_tail", edgePickTail);
    edgePickProgram->setAttribute("a_color_tip", edgePickTip);
    edgePickProgram->setAttribute("a_color_edge", edgePickEdge);

    fillEdgeGeometryBuffers(*edgePickProgram);
  }
}